

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

bool __thiscall
cmComputeLinkInformation::FinishLinkerSearchDirectories(cmComputeLinkInformation *this)

{
  cmState *pcVar1;
  cmake *pcVar2;
  bool bVar3;
  PolicyStatus PVar4;
  ostream *poVar5;
  PolicyID id;
  bool bVar6;
  pointer fullPath;
  string local_1f0;
  cmListFileBacktrace local_1d0;
  ostringstream w;
  
  bVar6 = true;
  if ((((this->OldLinkDirItems).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->OldLinkDirItems).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) &&
      ((this->OldUserFlagItems).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (this->OldUserFlagItems).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) && (this->OldLinkDirMode == true)) {
    PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0003(this->Target);
    if (PVar4 - REQUIRED_IF_USED < 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)&local_1d0,(cmPolicies *)0x3,id);
      poVar5 = std::operator<<((ostream *)&w,(string *)&local_1d0);
      std::operator<<(poVar5,"\n");
      std::__cxx11::string::~string((string *)&local_1d0);
      PrintLinkPolicyDiagnosis(this,(ostream *)&w);
      pcVar2 = this->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmGeneratorTarget::GetBacktrace(&local_1d0,this->Target);
      cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_1f0,&local_1d0,false);
      cmListFileBacktrace::~cmListFileBacktrace(&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
      bVar6 = false;
    }
    else if (PVar4 != NEW) {
      if (PVar4 == WARN) {
        pcVar1 = this->CMakeInstance->State;
        std::__cxx11::string::string((string *)&w,"CMP0003-WARNING-GIVEN",(allocator *)&local_1d0);
        bVar3 = cmState::GetGlobalPropertyAsBool(pcVar1,(string *)&w);
        std::__cxx11::string::~string((string *)&w);
        if (!bVar3) {
          pcVar1 = this->CMakeInstance->State;
          std::__cxx11::string::string((string *)&w,"CMP0003-WARNING-GIVEN",(allocator *)&local_1d0)
          ;
          cmState::SetGlobalProperty(pcVar1,(string *)&w,"1");
          std::__cxx11::string::~string((string *)&w);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
          PrintLinkPolicyDiagnosis(this,(ostream *)&w);
          pcVar2 = this->CMakeInstance;
          std::__cxx11::stringbuf::str();
          cmGeneratorTarget::GetBacktrace(&local_1d0,this->Target);
          cmake::IssueMessage(pcVar2,AUTHOR_WARNING,&local_1f0,&local_1d0,false);
          cmListFileBacktrace::~cmListFileBacktrace(&local_1d0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
        }
      }
      for (fullPath = (this->OldLinkDirItems).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          fullPath !=
          (this->OldLinkDirItems).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; fullPath = fullPath + 1) {
        cmOrderDirectories::AddLinkLibrary(this->OrderLinkerSearchPath,fullPath);
      }
    }
  }
  return bVar6;
}

Assistant:

std::string cmComputeLinkInformation::NoCaseExpression(const char* str)
{
  std::string ret;
  const char* s = str;
  while(*s)
    {
    if(*s == '.')
      {
      ret += *s;
      }
    else
      {
      ret += "[";
      ret += static_cast<char>(tolower(*s));
      ret += static_cast<char>(toupper(*s));
      ret += "]";
      }
    s++;
    }
  return ret;
}